

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

char * phosg::realpath(char *__name,char *__resolved)

{
  char *pcVar1;
  size_t __n;
  cannot_stat_file *this;
  
  *(char **)__name = __name + 0x10;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__name,0x1000,'\0'
            );
  pcVar1 = ::realpath(*(char **)__resolved,*(char **)__name);
  if (pcVar1 != (char *)0x0) {
    __n = strlen(*(char **)__name);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__name,__n);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::shrink_to_fit
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__name);
    return __name;
  }
  this = (cannot_stat_file *)__cxa_allocate_exception(0x20);
  cannot_stat_file::cannot_stat_file(this,(string *)__resolved);
  __cxa_throw(this,&cannot_stat_file::typeinfo,cannot_stat_file::~cannot_stat_file);
}

Assistant:

string realpath(const string& path) {
  string data(PATH_MAX, 0);
  if (!::realpath(path.c_str(), data.data())) {
    throw cannot_stat_file(path);
  }
  data.resize(strlen(data.c_str()));
  data.shrink_to_fit();
  return data;
}